

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

size_t __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
try_dequeue_bulk<coro_io::detail::client_queue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>::fake_iter>
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this,size_t param_2)

{
  ProducerBase *pPVar1;
  size_t sVar2;
  size_t sVar3;
  ProducerBase *this_00;
  fake_iter local_21;
  
  this_00 = *(ProducerBase **)this;
  sVar3 = 0;
  while( true ) {
    if (this_00 == (ProducerBase *)0x0) {
      return sVar3;
    }
    sVar2 = ProducerBase::
            dequeue_bulk<coro_io::detail::client_queue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>::fake_iter>
                      (this_00,&local_21,param_2 - sVar3);
    sVar3 = sVar3 + sVar2;
    if (sVar3 == param_2) break;
    pPVar1 = this_00 + 8;
    this_00 = (ProducerBase *)(*(long *)pPVar1 + -8);
    if (*(long *)pPVar1 == 0) {
      this_00 = (ProducerBase *)0x0;
    }
  }
  return param_2;
}

Assistant:

size_t try_dequeue_bulk(It itemFirst, size_t max) {
    size_t count = 0;
    for (auto ptr = producerListTail.load(std::memory_order_acquire);
         ptr != nullptr; ptr = ptr->next_prod()) {
      count += ptr->dequeue_bulk(itemFirst, max - count);
      if (count == max) {
        break;
      }
    }
    return count;
  }